

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

Index __thiscall
PlanningUnitMADPDiscrete::GetActionObservationHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index agentI,Index t,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *actions,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *observations)

{
  pointer pvVar1;
  pointer puVar2;
  pointer puVar3;
  Index IVar4;
  int iVar5;
  Index IVar6;
  undefined4 extraout_var;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong __n;
  long lVar10;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar11 [16];
  undefined1 extraout_var_00 [56];
  undefined1 auVar13 [64];
  vector<unsigned_int,_std::allocator<unsigned_int>_> AO_Is;
  allocator_type local_61;
  ulong local_60;
  double local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  value_type_conflict1 local_34;
  undefined1 auVar12 [64];
  undefined1 extraout_var_01 [56];
  
  uVar9 = (ulong)agentI;
  pvVar1 = (this->_m_firstAOHIforT).
           super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)(this->_m_firstAOHIforT).
                 super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  __n = uVar9;
  if (uVar9 <= uVar8 && uVar8 - uVar9 != 0) {
    local_60 = CONCAT44(local_60._4_4_,agentI);
    __n = (ulong)t;
    lVar10 = *(long *)&pvVar1[uVar9].
                       super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                       _M_impl.super__Vector_impl_data;
    if (__n < (ulong)((long)pvVar1[uVar9].
                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                            ._M_impl.super__Vector_impl_data._M_finish - lVar10 >> 3)) {
      IVar4 = Globals::CastLIndexToIndex(*(LIndex *)(lVar10 + __n * 8));
      iVar5 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[7])(this,local_60 & 0xffffffff);
      local_58 = (double)CONCAT44(extraout_var,iVar5);
      local_60 = (**(code **)((long)*this->_m_madp + 0xc0))(this->_m_madp,local_60 & 0xffffffff);
      auVar12._8_56_ = extraout_var_00;
      auVar12._0_8_ = extraout_XMM0_Qa;
      local_34 = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_50,__n,&local_34,&local_61);
      auVar11 = auVar12._0_16_;
      if (t != 0) {
        uVar8 = 0;
        do {
          puVar2 = (actions->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (((ulong)((long)(actions->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2) <= uVar8
              ) || (puVar3 = (observations->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start,
                   (ulong)((long)(observations->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2) <=
                   uVar8)) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar8);
          }
          IVar6 = IndexTools::ActionAndObservation_to_ActionObservationIndex
                            (puVar2[uVar8],puVar3[uVar8],(size_t)local_58,local_60);
          auVar11 = auVar12._0_16_;
          local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8] = IVar6;
          uVar8 = uVar8 + 1;
        } while (t != (Index)uVar8);
      }
      puVar2 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (t != 0) {
        uVar8 = (ulong)IVar4;
        auVar11 = vcvtusi2sd_avx512f(auVar11,local_60 * (long)local_58);
        local_58 = auVar11._0_8_;
        iVar5 = t - 1;
        lVar10 = 0;
        do {
          auVar13._0_8_ = pow(local_58,(double)iVar5);
          auVar13._8_56_ = extraout_var_01;
          lVar7 = vcvttsd2usi_avx512f(auVar13._0_16_);
          uVar8 = uVar8 + (ulong)*(uint *)((long)puVar2 + lVar10) * lVar7;
          IVar4 = (Index)uVar8;
          lVar10 = lVar10 + 4;
          iVar5 = iVar5 + -1;
        } while (__n << 2 != lVar10);
      }
      if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_50.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return IVar4;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",__n);
}

Assistant:

Index PlanningUnitMADPDiscrete::GetActionObservationHistoryIndex(
        Index agentI, 
        Index t, 
        const vector<Index>& actions,
        const vector<Index>& observations
        ) const
{
    //functioning is the same as for observation histories: only now the 
    //base is the nr AO.

    //-> first convert to AO indices:
    size_t first_AOHI=CastLIndexToIndex(_m_firstAOHIforT.at(agentI).at(t));
    size_t nrA = GetNrActions(agentI);
    size_t nrO = GetNrObservations(agentI);
    size_t nrAO = nrA * nrO;
    vector<Index> AO_Is(t, 0);
    for (Index ts=0; ts<t; ts++)
        AO_Is[ts] =  IndexTools::ActionAndObservation_to_ActionObservationIndex(
                    actions.at(ts), observations.at(ts), nrA, nrO);
    return( ComputeHistoryIndex(
                t, 
                first_AOHI,
                &AO_Is[0],
                nrAO
                )
          );    

    /*for (Index ts=0; ts<t; ts++)
    {
        int exponent = t-1 - ts;
        size_t b = (size_t) pow((double)nrAO, (double)(exponent));
        Index this_t_ao = IndexTools::
            ActionAndObservation_to_ActionObservationIndex(
                    actions.at(ts), observations.at(ts), nrA, nrO);
        this_AOHI += this_t_ao * b;
    }
    return(this_AOHI);*/
}